

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.hpp
# Opt level: O1

bool __thiscall
Diligent::Serializer<(Diligent::SerializerMode)1>::
SerializeArray<Diligent::ImmutableSamplerDesc_const*const,unsigned_int_const,bool(*)(Diligent::Serializer<(Diligent::SerializerMode)1>&,Diligent::ImmutableSamplerDesc_const&)>
          (Serializer<(Diligent::SerializerMode)1> *this,DynamicLinearAllocator *Allocator,
          ImmutableSamplerDesc **SrcArray,uint *Count,
          _func_bool_Serializer<(Diligent::SerializerMode)1>_ptr_ImmutableSamplerDesc_ptr
          *ElemSerializer)

{
  bool bVar1;
  bool bVar2;
  long lVar3;
  ulong uVar4;
  string msg;
  string local_50;
  
  bVar2 = (*Count == 0) != (*SrcArray != (ImmutableSamplerDesc *)0x0);
  if (!bVar2) {
    FormatString<char[26],char[38]>
              (&local_50,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"(SrcArray != nullptr) == (Count != 0)",
               (char (*) [38])CONCAT71((int7)((ulong)Count >> 8),bVar2));
    DebugAssertionFailed
              (local_50._M_dataplus._M_p,"SerializeArray",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/Serializer.hpp"
               ,0x1bd);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  bVar2 = Copy<unsigned_int_const>(this,Count,4);
  if (bVar2) {
    bVar2 = *Count == 0;
    if ((!bVar2) && (bVar1 = (*ElemSerializer)(this,*SrcArray), bVar1)) {
      uVar4 = 0;
      lVar3 = 0x48;
      do {
        uVar4 = uVar4 + 1;
        bVar2 = *Count <= uVar4;
        if (bVar2) {
          return bVar2;
        }
        bVar1 = (*ElemSerializer)(this,(ImmutableSamplerDesc *)
                                       ((long)((*SrcArray)->Desc).BorderColor + lVar3 + -0x2c));
        lVar3 = lVar3 + 0x48;
      } while (bVar1);
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool Serializer<Mode>::SerializeArray(DynamicLinearAllocator* Allocator,
                                      ElemPtrType&            SrcArray,
                                      CountType&              Count,
                                      ArrayElemSerializerType ElemSerializer)
{
    VERIFY_EXPR((SrcArray != nullptr) == (Count != 0));

    if (!(*this)(Count))
        return false;

    for (size_t i = 0; i < static_cast<size_t>(Count); ++i)
    {
        if (!ElemSerializer(*this, SrcArray[i]))
            return false;
    }

    return true;
}